

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  byte bVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined4 uVar9;
  float *vertices;
  undefined1 (*pauVar10) [16];
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [16];
  long lVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  Scene *pSVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  AABBNodeMB4D *node1;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 (*pauVar31) [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar73 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  uint uVar80;
  uint uVar81;
  uint uVar82;
  undefined1 auVar79 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2700 [16];
  Scene *local_26f0;
  ulong local_26e8;
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  undefined1 local_26c0 [16];
  undefined1 local_26b0 [16];
  undefined1 (*local_2698) [16];
  ulong local_2690;
  ulong local_2688;
  ulong local_2680;
  ulong local_2678;
  ulong local_2670;
  ulong local_2668;
  RTCFilterFunctionNArguments local_2660;
  undefined8 local_2630;
  undefined8 uStack_2628;
  undefined1 local_2620 [32];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25d0 [16];
  float local_25c0 [4];
  float local_25b0 [4];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined4 local_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined4 local_2500;
  undefined4 uStack_24fc;
  undefined4 uStack_24f8;
  undefined4 uStack_24f4;
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  undefined4 local_24d0;
  undefined4 uStack_24cc;
  undefined4 uStack_24c8;
  undefined4 uStack_24c4;
  undefined4 local_24c0;
  undefined4 uStack_24bc;
  undefined4 uStack_24b8;
  undefined4 uStack_24b4;
  uint local_24b0;
  uint uStack_24ac;
  uint uStack_24a8;
  uint uStack_24a4;
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar10 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar58 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_23c0._4_4_ = fVar58;
  local_23c0._0_4_ = fVar58;
  local_23c0._8_4_ = fVar58;
  local_23c0._12_4_ = fVar58;
  local_23c0._16_4_ = fVar58;
  local_23c0._20_4_ = fVar58;
  local_23c0._24_4_ = fVar58;
  local_23c0._28_4_ = fVar58;
  auVar62 = ZEXT3264(local_23c0);
  fVar68 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = fVar68;
  local_23e0._0_4_ = fVar68;
  local_23e0._8_4_ = fVar68;
  local_23e0._12_4_ = fVar68;
  local_23e0._16_4_ = fVar68;
  local_23e0._20_4_ = fVar68;
  local_23e0._24_4_ = fVar68;
  local_23e0._28_4_ = fVar68;
  auVar67 = ZEXT3264(local_23e0);
  fVar74 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = fVar74;
  local_2400._0_4_ = fVar74;
  local_2400._8_4_ = fVar74;
  local_2400._12_4_ = fVar74;
  local_2400._16_4_ = fVar74;
  local_2400._20_4_ = fVar74;
  local_2400._24_4_ = fVar74;
  local_2400._28_4_ = fVar74;
  auVar73 = ZEXT3264(local_2400);
  fVar58 = fVar58 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar68 = fVar68 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar74 = fVar74 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2690 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_2668 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar30 = local_2690 ^ 0x20;
  uVar29 = local_2668 ^ 0x20;
  iVar2 = (tray->tfar).field_0.i[k];
  auVar41 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  local_2420._0_8_ = CONCAT44(fVar58,fVar58) ^ 0x8000000080000000;
  local_2420._8_4_ = -fVar58;
  local_2420._12_4_ = -fVar58;
  local_2420._16_4_ = -fVar58;
  local_2420._20_4_ = -fVar58;
  local_2420._24_4_ = -fVar58;
  local_2420._28_4_ = -fVar58;
  auVar79 = ZEXT3264(local_2420);
  local_2440._0_8_ = CONCAT44(fVar68,fVar68) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar68;
  local_2440._12_4_ = -fVar68;
  local_2440._16_4_ = -fVar68;
  local_2440._20_4_ = -fVar68;
  local_2440._24_4_ = -fVar68;
  local_2440._28_4_ = -fVar68;
  auVar86 = ZEXT3264(local_2440);
  local_2460._0_8_ = CONCAT44(fVar74,fVar74) ^ 0x8000000080000000;
  local_2460._8_4_ = -fVar74;
  local_2460._12_4_ = -fVar74;
  local_2460._16_4_ = -fVar74;
  local_2460._20_4_ = -fVar74;
  local_2460._24_4_ = -fVar74;
  local_2460._28_4_ = -fVar74;
  auVar89 = ZEXT3264(local_2460);
  iVar2 = (tray->tnear).field_0.i[k];
  local_2480._4_4_ = iVar2;
  local_2480._0_4_ = iVar2;
  local_2480._8_4_ = iVar2;
  local_2480._12_4_ = iVar2;
  local_2480._16_4_ = iVar2;
  local_2480._20_4_ = iVar2;
  local_2480._24_4_ = iVar2;
  local_2480._28_4_ = iVar2;
  auVar92 = ZEXT3264(local_2480);
  local_2698 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  uVar11 = local_2690;
LAB_005ce07e:
  do {
    pauVar31 = pauVar10 + -1;
    pauVar10 = pauVar10 + -1;
    if (*(float *)(*pauVar31 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar18 = *(ulong *)*pauVar10;
      while ((uVar18 & 8) == 0) {
        uVar26 = uVar18 & 0xfffffffffffffff0;
        uVar9 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar49._4_4_ = uVar9;
        auVar49._0_4_ = uVar9;
        auVar49._8_4_ = uVar9;
        auVar49._12_4_ = uVar9;
        auVar49._16_4_ = uVar9;
        auVar49._20_4_ = uVar9;
        auVar49._24_4_ = uVar9;
        auVar49._28_4_ = uVar9;
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + uVar11),auVar49,
                                  *(undefined1 (*) [32])(uVar26 + 0x40 + uVar11));
        auVar61 = auVar62._0_32_;
        auVar78 = auVar79._0_32_;
        auVar42 = vfmadd213ps_fma(ZEXT1632(auVar42),auVar61,auVar78);
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + uVar23),auVar49,
                                  *(undefined1 (*) [32])(uVar26 + 0x40 + uVar23));
        auVar66 = auVar67._0_32_;
        auVar85 = auVar86._0_32_;
        auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar66,auVar85);
        auVar7 = vpmaxsd_avx2(ZEXT1632(auVar42),ZEXT1632(auVar50));
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + local_2668),auVar49,
                                  *(undefined1 (*) [32])(uVar26 + 0x40 + local_2668));
        auVar72 = auVar73._0_32_;
        auVar88 = auVar89._0_32_;
        auVar42 = vfmadd213ps_fma(ZEXT1632(auVar42),auVar72,auVar88);
        auVar8 = vpmaxsd_avx2(ZEXT1632(auVar42),auVar92._0_32_);
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + uVar30),auVar49,
                                  *(undefined1 (*) [32])(uVar26 + 0x40 + uVar30));
        local_2620 = vpmaxsd_avx2(auVar7,auVar8);
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + (uVar23 ^ 0x20)),auVar49,
                                  *(undefined1 (*) [32])(uVar26 + 0x40 + (uVar23 ^ 0x20)));
        auVar42 = vfmadd213ps_fma(ZEXT1632(auVar42),auVar61,auVar78);
        auVar50 = vfmadd213ps_fma(ZEXT1632(auVar50),auVar66,auVar85);
        auVar7 = vpminsd_avx2(ZEXT1632(auVar42),ZEXT1632(auVar50));
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + uVar29),auVar49,
                                  *(undefined1 (*) [32])(uVar26 + 0x40 + uVar29));
        auVar42 = vfmadd213ps_fma(ZEXT1632(auVar42),auVar72,auVar88);
        auVar8 = vpminsd_avx2(ZEXT1632(auVar42),auVar41._0_32_);
        auVar7 = vpminsd_avx2(auVar7,auVar8);
        auVar7 = vcmpps_avx(local_2620,auVar7,2);
        if (((uint)uVar18 & 7) == 6) {
          auVar8 = vcmpps_avx(*(undefined1 (*) [32])(uVar26 + 0x1c0),auVar49,2);
          auVar49 = vcmpps_avx(auVar49,*(undefined1 (*) [32])(uVar26 + 0x1e0),1);
          auVar8 = vandps_avx(auVar8,auVar49);
          auVar7 = vandps_avx(auVar8,auVar7);
          auVar42 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
        }
        else {
          auVar42 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
        }
        auVar42 = vpsllw_avx(auVar42,0xf);
        if ((((((((auVar42 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar42 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar42 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar42 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar42 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar42[0xf]
           ) {
          if (pauVar10 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_005ce07e;
        }
        auVar42 = vpacksswb_avx(auVar42,auVar42);
        bVar6 = SUB161(auVar42 >> 7,0) & 1 | (SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                (SUB161(auVar42 >> 0x17,0) & 1) << 2 | (SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                (SUB161(auVar42 >> 0x27,0) & 1) << 4 | (SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                (SUB161(auVar42 >> 0x37,0) & 1) << 6 | SUB161(auVar42 >> 0x3f,0) << 7;
        lVar12 = 0;
        for (uVar18 = (ulong)bVar6; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
          lVar12 = lVar12 + 1;
        }
        uVar18 = *(ulong *)(uVar26 + lVar12 * 8);
        uVar14 = bVar6 - 1 & (uint)bVar6;
        uVar15 = (ulong)uVar14;
        if (uVar14 != 0) {
          uVar80 = *(uint *)(local_2620 + lVar12 * 4);
          lVar12 = 0;
          for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            lVar12 = lVar12 + 1;
          }
          uVar14 = uVar14 - 1 & uVar14;
          uVar21 = (ulong)uVar14;
          uVar15 = *(ulong *)(uVar26 + lVar12 * 8);
          uVar81 = *(uint *)(local_2620 + lVar12 * 4);
          if (uVar14 == 0) {
            if (uVar80 < uVar81) {
              *(ulong *)*pauVar10 = uVar15;
              *(uint *)(*pauVar10 + 8) = uVar81;
              pauVar10 = pauVar10 + 1;
            }
            else {
              *(ulong *)*pauVar10 = uVar18;
              *(uint *)(*pauVar10 + 8) = uVar80;
              pauVar10 = pauVar10 + 1;
              uVar18 = uVar15;
            }
          }
          else {
            auVar42._8_8_ = 0;
            auVar42._0_8_ = uVar18;
            auVar42 = vpunpcklqdq_avx(auVar42,ZEXT416(uVar80));
            auVar50._8_8_ = 0;
            auVar50._0_8_ = uVar15;
            auVar50 = vpunpcklqdq_avx(auVar50,ZEXT416(uVar81));
            lVar12 = 0;
            for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              lVar12 = lVar12 + 1;
            }
            uVar14 = uVar14 - 1 & uVar14;
            uVar18 = (ulong)uVar14;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = *(ulong *)(uVar26 + lVar12 * 8);
            auVar43 = vpunpcklqdq_avx(auVar54,ZEXT416(*(uint *)(local_2620 + lVar12 * 4)));
            auVar54 = vpcmpgtd_avx(auVar50,auVar42);
            if (uVar14 == 0) {
              auVar59 = vpshufd_avx(auVar54,0xaa);
              auVar54 = vblendvps_avx(auVar50,auVar42,auVar59);
              auVar42 = vblendvps_avx(auVar42,auVar50,auVar59);
              auVar50 = vpcmpgtd_avx(auVar43,auVar54);
              auVar59 = vpshufd_avx(auVar50,0xaa);
              auVar50 = vblendvps_avx(auVar43,auVar54,auVar59);
              auVar54 = vblendvps_avx(auVar54,auVar43,auVar59);
              auVar43 = vpcmpgtd_avx(auVar54,auVar42);
              auVar59 = vpshufd_avx(auVar43,0xaa);
              auVar43 = vblendvps_avx(auVar54,auVar42,auVar59);
              auVar42 = vblendvps_avx(auVar42,auVar54,auVar59);
              *pauVar10 = auVar42;
              pauVar10[1] = auVar43;
              uVar18 = auVar50._0_8_;
              pauVar10 = pauVar10 + 2;
            }
            else {
              lVar12 = 0;
              for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                lVar12 = lVar12 + 1;
              }
              uVar14 = uVar14 - 1 & uVar14;
              uVar15 = (ulong)uVar14;
              auVar59._8_8_ = 0;
              auVar59._0_8_ = *(ulong *)(uVar26 + lVar12 * 8);
              auVar59 = vpunpcklqdq_avx(auVar59,ZEXT416(*(uint *)(local_2620 + lVar12 * 4)));
              if (uVar14 == 0) {
                auVar36 = vpshufd_avx(auVar54,0xaa);
                auVar54 = vblendvps_avx(auVar50,auVar42,auVar36);
                auVar42 = vblendvps_avx(auVar42,auVar50,auVar36);
                auVar50 = vpcmpgtd_avx(auVar59,auVar43);
                auVar36 = vpshufd_avx(auVar50,0xaa);
                auVar50 = vblendvps_avx(auVar59,auVar43,auVar36);
                auVar43 = vblendvps_avx(auVar43,auVar59,auVar36);
                auVar59 = vpcmpgtd_avx(auVar43,auVar42);
                auVar36 = vpshufd_avx(auVar59,0xaa);
                auVar59 = vblendvps_avx(auVar43,auVar42,auVar36);
                auVar42 = vblendvps_avx(auVar42,auVar43,auVar36);
                auVar43 = vpcmpgtd_avx(auVar50,auVar54);
                auVar36 = vpshufd_avx(auVar43,0xaa);
                auVar43 = vblendvps_avx(auVar50,auVar54,auVar36);
                auVar50 = vblendvps_avx(auVar54,auVar50,auVar36);
                auVar54 = vpcmpgtd_avx(auVar59,auVar50);
                auVar36 = vpshufd_avx(auVar54,0xaa);
                auVar54 = vblendvps_avx(auVar59,auVar50,auVar36);
                auVar50 = vblendvps_avx(auVar50,auVar59,auVar36);
                *pauVar10 = auVar42;
                pauVar10[1] = auVar50;
                pauVar10[2] = auVar54;
                uVar18 = auVar43._0_8_;
                pauVar31 = pauVar10 + 3;
              }
              else {
                *pauVar10 = auVar42;
                pauVar10[1] = auVar50;
                pauVar10[2] = auVar43;
                pauVar10[3] = auVar59;
                lVar12 = 0x30;
                do {
                  lVar13 = lVar12;
                  lVar12 = 0;
                  for (uVar18 = uVar15; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000
                      ) {
                    lVar12 = lVar12 + 1;
                  }
                  uVar18 = *(ulong *)(uVar26 + lVar12 * 8);
                  auVar43._8_8_ = 0;
                  auVar43._0_8_ = uVar18;
                  auVar42 = vpunpcklqdq_avx(auVar43,ZEXT416(*(uint *)(local_2620 + lVar12 * 4)));
                  *(undefined1 (*) [16])(pauVar10[1] + lVar13) = auVar42;
                  uVar15 = uVar15 - 1 & uVar15;
                  lVar12 = lVar13 + 0x10;
                } while (uVar15 != 0);
                pauVar31 = (undefined1 (*) [16])(pauVar10[1] + lVar13);
                if (lVar13 + 0x10 != 0) {
                  lVar12 = 0x10;
                  pauVar16 = pauVar10;
                  do {
                    auVar42 = pauVar16[1];
                    pauVar16 = pauVar16 + 1;
                    uVar14 = vextractps_avx(auVar42,2);
                    lVar13 = lVar12;
                    do {
                      if (uVar14 <= *(uint *)(pauVar10[-1] + lVar13 + 8)) {
                        pauVar19 = (undefined1 (*) [16])(*pauVar10 + lVar13);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar10 + lVar13) =
                           *(undefined1 (*) [16])(pauVar10[-1] + lVar13);
                      lVar13 = lVar13 + -0x10;
                      pauVar19 = pauVar10;
                    } while (lVar13 != 0);
                    *pauVar19 = auVar42;
                    lVar12 = lVar12 + 0x10;
                  } while (pauVar31 != pauVar16);
                  uVar18 = *(ulong *)*pauVar31;
                }
              }
              auVar62 = ZEXT3264(auVar61);
              auVar67 = ZEXT3264(auVar66);
              auVar73 = ZEXT3264(auVar72);
              auVar79 = ZEXT3264(auVar78);
              auVar86 = ZEXT3264(auVar85);
              auVar89 = ZEXT3264(auVar88);
              auVar92 = ZEXT3264(auVar92._0_32_);
              pauVar10 = pauVar31;
            }
          }
        }
      }
      local_2688 = (ulong)((uint)uVar18 & 0xf) - 8;
      if (local_2688 != 0) {
        uVar18 = uVar18 & 0xfffffffffffffff0;
        uVar11 = 0;
        do {
          lVar17 = uVar11 * 0x50;
          pSVar20 = context->scene;
          pGVar4 = (pSVar20->geometries).items[*(uint *)(uVar18 + 0x30 + lVar17)].ptr;
          fVar58 = (pGVar4->time_range).lower;
          fVar58 = pGVar4->fnumTimeSegments *
                   ((*(float *)(ray + k * 4 + 0x70) - fVar58) /
                   ((pGVar4->time_range).upper - fVar58));
          auVar42 = vroundss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),9);
          auVar42 = vminss_avx(auVar42,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
          auVar44 = vmaxss_avx(ZEXT816(0),auVar42);
          lVar13 = (long)(int)auVar44._0_4_ * 0x38;
          uVar28 = (ulong)*(uint *)(uVar18 + 4 + lVar17);
          lVar12 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar13);
          lVar13 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar13);
          auVar42 = *(undefined1 (*) [16])(lVar12 + (ulong)*(uint *)(uVar18 + lVar17) * 4);
          uVar27 = (ulong)*(uint *)(uVar18 + 0x10 + lVar17);
          auVar50 = *(undefined1 (*) [16])(lVar12 + uVar27 * 4);
          uVar26 = (ulong)*(uint *)(uVar18 + 0x20 + lVar17);
          auVar52 = *(undefined1 (*) [16])(lVar12 + uVar26 * 4);
          auVar54 = *(undefined1 (*) [16])(lVar12 + uVar28 * 4);
          uVar15 = (ulong)*(uint *)(uVar18 + 0x14 + lVar17);
          auVar43 = *(undefined1 (*) [16])(lVar12 + uVar15 * 4);
          uVar21 = (ulong)*(uint *)(uVar18 + 0x24 + lVar17);
          auVar55 = *(undefined1 (*) [16])(lVar12 + uVar21 * 4);
          uVar22 = (ulong)*(uint *)(uVar18 + 8 + lVar17);
          auVar59 = *(undefined1 (*) [16])(lVar12 + uVar22 * 4);
          local_2678 = (ulong)*(uint *)(uVar18 + 0x18 + lVar17);
          auVar36 = *(undefined1 (*) [16])(lVar12 + local_2678 * 4);
          uVar24 = (ulong)*(uint *)(uVar18 + 0x28 + lVar17);
          auVar32 = *(undefined1 (*) [16])(lVar12 + uVar24 * 4);
          uVar25 = (ulong)*(uint *)(uVar18 + 0xc + lVar17);
          auVar38 = *(undefined1 (*) [16])(lVar12 + uVar25 * 4);
          local_2680 = (ulong)*(uint *)(uVar18 + 0x1c + lVar17);
          auVar33 = *(undefined1 (*) [16])(lVar12 + local_2680 * 4);
          local_2670 = (ulong)*(uint *)(uVar18 + 0x2c + lVar17);
          auVar34 = *(undefined1 (*) [16])(lVar12 + local_2670 * 4);
          auVar35 = *(undefined1 (*) [16])(lVar13 + (ulong)*(uint *)(uVar18 + lVar17) * 4);
          auVar45 = *(undefined1 (*) [16])(lVar13 + uVar27 * 4);
          fVar58 = fVar58 - auVar44._0_4_;
          auVar44 = vunpcklps_avx(auVar42,auVar59);
          auVar59 = vunpckhps_avx(auVar42,auVar59);
          auVar51 = vunpcklps_avx(auVar54,auVar38);
          auVar54 = vunpckhps_avx(auVar54,auVar38);
          auVar42 = *(undefined1 (*) [16])(lVar13 + uVar28 * 4);
          local_2550 = vunpcklps_avx(auVar59,auVar54);
          auVar38 = vunpcklps_avx(auVar44,auVar51);
          auVar59 = vunpckhps_avx(auVar44,auVar51);
          auVar44 = vunpcklps_avx(auVar50,auVar36);
          auVar54 = vunpckhps_avx(auVar50,auVar36);
          auVar36 = vunpcklps_avx(auVar43,auVar33);
          auVar43 = vunpckhps_avx(auVar43,auVar33);
          auVar50 = *(undefined1 (*) [16])(lVar13 + uVar22 * 4);
          local_2540 = vunpcklps_avx(auVar54,auVar43);
          auVar33 = vunpcklps_avx(auVar44,auVar36);
          local_2560 = vunpckhps_avx(auVar44,auVar36);
          auVar44 = vunpcklps_avx(auVar52,auVar32);
          auVar43 = vunpckhps_avx(auVar52,auVar32);
          auVar32 = vunpcklps_avx(auVar55,auVar34);
          auVar36 = vunpckhps_avx(auVar55,auVar34);
          auVar54 = *(undefined1 (*) [16])(lVar13 + uVar25 * 4);
          local_26d0 = vunpcklps_avx(auVar43,auVar36);
          local_26e0 = vunpcklps_avx(auVar44,auVar32);
          local_2530 = vunpckhps_avx(auVar44,auVar32);
          auVar43 = vunpcklps_avx(auVar35,auVar50);
          auVar50 = vunpckhps_avx(auVar35,auVar50);
          auVar36 = vunpcklps_avx(auVar42,auVar54);
          auVar54 = vunpckhps_avx(auVar42,auVar54);
          auVar42 = *(undefined1 (*) [16])(lVar13 + local_2678 * 4);
          auVar32 = vunpcklps_avx(auVar50,auVar54);
          auVar34 = vunpcklps_avx(auVar43,auVar36);
          auVar54 = vunpckhps_avx(auVar43,auVar36);
          auVar36 = vunpcklps_avx(auVar45,auVar42);
          auVar43 = vunpckhps_avx(auVar45,auVar42);
          auVar42 = *(undefined1 (*) [16])(lVar13 + uVar15 * 4);
          auVar50 = *(undefined1 (*) [16])(lVar13 + local_2680 * 4);
          auVar35 = vunpcklps_avx(auVar42,auVar50);
          auVar42 = vunpckhps_avx(auVar42,auVar50);
          auVar45 = vunpcklps_avx(auVar43,auVar42);
          auVar44 = vunpcklps_avx(auVar36,auVar35);
          auVar43 = vunpckhps_avx(auVar36,auVar35);
          auVar42 = *(undefined1 (*) [16])(lVar13 + uVar26 * 4);
          auVar50 = *(undefined1 (*) [16])(lVar13 + uVar24 * 4);
          auVar35 = vunpcklps_avx(auVar42,auVar50);
          auVar36 = vunpckhps_avx(auVar42,auVar50);
          auVar42 = *(undefined1 (*) [16])(lVar13 + uVar21 * 4);
          auVar50 = *(undefined1 (*) [16])(lVar13 + local_2670 * 4);
          auVar51 = vunpcklps_avx(auVar42,auVar50);
          auVar42 = vunpckhps_avx(auVar42,auVar50);
          auVar50 = vunpcklps_avx(auVar36,auVar42);
          auVar36 = vunpcklps_avx(auVar35,auVar51);
          auVar42 = vunpckhps_avx(auVar35,auVar51);
          fVar68 = 1.0 - fVar58;
          auVar90._4_4_ = fVar68;
          auVar90._0_4_ = fVar68;
          auVar90._8_4_ = fVar68;
          auVar90._12_4_ = fVar68;
          auVar60._0_4_ = fVar58 * auVar34._0_4_;
          auVar60._4_4_ = fVar58 * auVar34._4_4_;
          auVar60._8_4_ = fVar58 * auVar34._8_4_;
          auVar60._12_4_ = fVar58 * auVar34._12_4_;
          auVar38 = vfmadd231ps_fma(auVar60,auVar90,auVar38);
          auVar63._0_4_ = fVar58 * auVar54._0_4_;
          auVar63._4_4_ = fVar58 * auVar54._4_4_;
          auVar63._8_4_ = fVar58 * auVar54._8_4_;
          auVar63._12_4_ = fVar58 * auVar54._12_4_;
          auVar34 = vfmadd231ps_fma(auVar63,auVar90,auVar59);
          auVar69._0_4_ = fVar58 * auVar32._0_4_;
          auVar69._4_4_ = fVar58 * auVar32._4_4_;
          auVar69._8_4_ = fVar58 * auVar32._8_4_;
          auVar69._12_4_ = fVar58 * auVar32._12_4_;
          auVar35 = vfmadd231ps_fma(auVar69,auVar90,local_2550);
          auVar32._0_4_ = fVar58 * auVar44._0_4_;
          auVar32._4_4_ = fVar58 * auVar44._4_4_;
          auVar32._8_4_ = fVar58 * auVar44._8_4_;
          auVar32._12_4_ = fVar58 * auVar44._12_4_;
          auVar54 = vfmadd231ps_fma(auVar32,auVar90,auVar33);
          auVar44._0_4_ = fVar58 * auVar43._0_4_;
          auVar44._4_4_ = fVar58 * auVar43._4_4_;
          auVar44._8_4_ = fVar58 * auVar43._8_4_;
          auVar44._12_4_ = fVar58 * auVar43._12_4_;
          auVar43 = vfmadd231ps_fma(auVar44,auVar90,local_2560);
          auVar51._0_4_ = fVar58 * auVar45._0_4_;
          auVar51._4_4_ = fVar58 * auVar45._4_4_;
          auVar51._8_4_ = fVar58 * auVar45._8_4_;
          auVar51._12_4_ = fVar58 * auVar45._12_4_;
          auVar59 = vfmadd231ps_fma(auVar51,auVar90,local_2540);
          puVar1 = (undefined8 *)(uVar18 + 0x30 + lVar17);
          local_2520 = *puVar1;
          uStack_2518 = puVar1[1];
          puVar1 = (undefined8 *)(uVar18 + 0x40 + lVar17);
          auVar56._0_4_ = fVar58 * auVar36._0_4_;
          auVar56._4_4_ = fVar58 * auVar36._4_4_;
          auVar56._8_4_ = fVar58 * auVar36._8_4_;
          auVar56._12_4_ = fVar58 * auVar36._12_4_;
          auVar83._0_4_ = fVar58 * auVar42._0_4_;
          auVar83._4_4_ = fVar58 * auVar42._4_4_;
          auVar83._8_4_ = fVar58 * auVar42._8_4_;
          auVar83._12_4_ = fVar58 * auVar42._12_4_;
          auVar93._0_4_ = fVar58 * auVar50._0_4_;
          auVar93._4_4_ = fVar58 * auVar50._4_4_;
          auVar93._8_4_ = fVar58 * auVar50._8_4_;
          auVar93._12_4_ = fVar58 * auVar50._12_4_;
          auVar36 = vfmadd231ps_fma(auVar56,auVar90,local_26e0);
          auVar32 = vfmadd231ps_fma(auVar83,auVar90,local_2530);
          auVar33 = vfmadd231ps_fma(auVar93,auVar90,local_26d0);
          local_2630 = *puVar1;
          uStack_2628 = puVar1[1];
          auVar50 = vsubps_avx(auVar38,auVar54);
          auVar42 = vsubps_avx(auVar34,auVar43);
          auVar54 = vsubps_avx(auVar35,auVar59);
          auVar43 = vsubps_avx(auVar36,auVar38);
          auVar59 = vsubps_avx(auVar32,auVar34);
          auVar36 = vsubps_avx(auVar33,auVar35);
          auVar45._0_4_ = auVar42._0_4_ * auVar36._0_4_;
          auVar45._4_4_ = auVar42._4_4_ * auVar36._4_4_;
          auVar45._8_4_ = auVar42._8_4_ * auVar36._8_4_;
          auVar45._12_4_ = auVar42._12_4_ * auVar36._12_4_;
          local_2590 = vfmsub231ps_fma(auVar45,auVar59,auVar54);
          auVar55._0_4_ = auVar54._0_4_ * auVar43._0_4_;
          auVar55._4_4_ = auVar54._4_4_ * auVar43._4_4_;
          auVar55._8_4_ = auVar54._8_4_ * auVar43._8_4_;
          auVar55._12_4_ = auVar54._12_4_ * auVar43._12_4_;
          local_2580 = vfmsub231ps_fma(auVar55,auVar36,auVar50);
          uVar9 = *(undefined4 *)(ray + k * 4);
          auVar52._4_4_ = uVar9;
          auVar52._0_4_ = uVar9;
          auVar52._8_4_ = uVar9;
          auVar52._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar57._4_4_ = uVar9;
          auVar57._0_4_ = uVar9;
          auVar57._8_4_ = uVar9;
          auVar57._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar33._4_4_ = uVar9;
          auVar33._0_4_ = uVar9;
          auVar33._8_4_ = uVar9;
          auVar33._12_4_ = uVar9;
          fVar58 = *(float *)(ray + k * 4 + 0x40);
          auVar91._4_4_ = fVar58;
          auVar91._0_4_ = fVar58;
          auVar91._8_4_ = fVar58;
          auVar91._12_4_ = fVar58;
          auVar32 = vsubps_avx(auVar38,auVar52);
          fVar68 = *(float *)(ray + k * 4 + 0x50);
          auVar94._4_4_ = fVar68;
          auVar94._0_4_ = fVar68;
          auVar94._8_4_ = fVar68;
          auVar94._12_4_ = fVar68;
          auVar38 = vsubps_avx(auVar34,auVar57);
          fVar74 = *(float *)(ray + k * 4 + 0x60);
          auVar95._4_4_ = fVar74;
          auVar95._0_4_ = fVar74;
          auVar95._8_4_ = fVar74;
          auVar95._12_4_ = fVar74;
          auVar33 = vsubps_avx(auVar35,auVar33);
          auVar34._0_4_ = fVar58 * auVar38._0_4_;
          auVar34._4_4_ = fVar58 * auVar38._4_4_;
          auVar34._8_4_ = fVar58 * auVar38._8_4_;
          auVar34._12_4_ = fVar58 * auVar38._12_4_;
          auVar34 = vfmsub231ps_fma(auVar34,auVar32,auVar94);
          auVar70._0_4_ = auVar36._0_4_ * auVar34._0_4_;
          auVar70._4_4_ = auVar36._4_4_ * auVar34._4_4_;
          auVar70._8_4_ = auVar36._8_4_ * auVar34._8_4_;
          auVar70._12_4_ = auVar36._12_4_ * auVar34._12_4_;
          auVar35._0_4_ = auVar54._0_4_ * auVar34._0_4_;
          auVar35._4_4_ = auVar54._4_4_ * auVar34._4_4_;
          auVar35._8_4_ = auVar54._8_4_ * auVar34._8_4_;
          auVar35._12_4_ = auVar54._12_4_ * auVar34._12_4_;
          auVar64._0_4_ = fVar74 * auVar32._0_4_;
          auVar64._4_4_ = fVar74 * auVar32._4_4_;
          auVar64._8_4_ = fVar74 * auVar32._8_4_;
          auVar64._12_4_ = fVar74 * auVar32._12_4_;
          auVar36 = vfmsub231ps_fma(auVar64,auVar33,auVar91);
          auVar54 = vfmadd231ps_fma(auVar70,auVar36,auVar59);
          auVar36 = vfmadd231ps_fma(auVar35,auVar42,auVar36);
          auVar65._0_4_ = auVar59._0_4_ * auVar50._0_4_;
          auVar65._4_4_ = auVar59._4_4_ * auVar50._4_4_;
          auVar65._8_4_ = auVar59._8_4_ * auVar50._8_4_;
          auVar65._12_4_ = auVar59._12_4_ * auVar50._12_4_;
          local_2570 = vfmsub231ps_fma(auVar65,auVar43,auVar42);
          auVar84._0_4_ = fVar68 * auVar33._0_4_;
          auVar84._4_4_ = fVar68 * auVar33._4_4_;
          auVar84._8_4_ = fVar68 * auVar33._8_4_;
          auVar84._12_4_ = fVar68 * auVar33._12_4_;
          auVar34 = vfmsub231ps_fma(auVar84,auVar38,auVar95);
          auVar87._0_4_ = fVar74 * local_2570._0_4_;
          auVar87._4_4_ = fVar74 * local_2570._4_4_;
          auVar87._8_4_ = fVar74 * local_2570._8_4_;
          auVar87._12_4_ = fVar74 * local_2570._12_4_;
          auVar42 = vfmadd231ps_fma(auVar87,local_2580,auVar94);
          auVar59 = vfmadd231ps_fma(auVar42,local_2590,auVar91);
          auVar77._8_4_ = 0x80000000;
          auVar77._0_8_ = 0x8000000080000000;
          auVar77._12_4_ = 0x80000000;
          auVar54 = vfmadd231ps_fma(auVar54,auVar34,auVar43);
          auVar42 = vandps_avx(auVar59,auVar77);
          uVar14 = auVar42._0_4_;
          local_2620._0_4_ = (float)(uVar14 ^ auVar54._0_4_);
          uVar80 = auVar42._4_4_;
          local_2620._4_4_ = (float)(uVar80 ^ auVar54._4_4_);
          uVar81 = auVar42._8_4_;
          local_2620._8_4_ = (float)(uVar81 ^ auVar54._8_4_);
          uVar82 = auVar42._12_4_;
          local_2620._12_4_ = (float)(uVar82 ^ auVar54._12_4_);
          auVar42 = vfmadd231ps_fma(auVar36,auVar50,auVar34);
          local_2620._16_4_ = (float)(uVar14 ^ auVar42._0_4_);
          local_2620._20_4_ = (float)(uVar80 ^ auVar42._4_4_);
          local_2620._24_4_ = (float)(uVar81 ^ auVar42._8_4_);
          local_2620._28_4_ = (float)(uVar82 ^ auVar42._12_4_);
          auVar54 = ZEXT816(0) << 0x20;
          auVar42 = vcmpps_avx(local_2620._0_16_,auVar54,5);
          auVar50 = vcmpps_avx(local_2620._16_16_,auVar54,5);
          auVar42 = vandps_avx(auVar50,auVar42);
          auVar71._8_4_ = 0x7fffffff;
          auVar71._0_8_ = 0x7fffffff7fffffff;
          auVar71._12_4_ = 0x7fffffff;
          local_25f0 = vandps_avx(auVar59,auVar71);
          auVar50 = vcmpps_avx(auVar59,auVar54,4);
          auVar42 = vandps_avx(auVar50,auVar42);
          auVar36._0_4_ = local_2620._0_4_ + local_2620._16_4_;
          auVar36._4_4_ = local_2620._4_4_ + local_2620._20_4_;
          auVar36._8_4_ = local_2620._8_4_ + local_2620._24_4_;
          auVar36._12_4_ = local_2620._12_4_ + local_2620._28_4_;
          auVar50 = vcmpps_avx(auVar36,local_25f0,2);
          auVar54 = auVar50 & auVar42;
          local_26e8 = uVar11;
          if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar54[0xf] < '\0') {
            auVar42 = vandps_avx(auVar42,auVar50);
            auVar37._0_4_ = local_2570._0_4_ * auVar33._0_4_;
            auVar37._4_4_ = local_2570._4_4_ * auVar33._4_4_;
            auVar37._8_4_ = local_2570._8_4_ * auVar33._8_4_;
            auVar37._12_4_ = local_2570._12_4_ * auVar33._12_4_;
            auVar50 = vfmadd213ps_fma(auVar38,local_2580,auVar37);
            auVar50 = vfmadd213ps_fma(auVar32,local_2590,auVar50);
            local_2600._0_4_ = (float)(uVar14 ^ auVar50._0_4_);
            local_2600._4_4_ = (float)(uVar80 ^ auVar50._4_4_);
            local_2600._8_4_ = (float)(uVar81 ^ auVar50._8_4_);
            local_2600._12_4_ = (float)(uVar82 ^ auVar50._12_4_);
            fVar58 = *(float *)(ray + k * 4 + 0x30);
            auVar38._0_4_ = local_25f0._0_4_ * fVar58;
            auVar38._4_4_ = local_25f0._4_4_ * fVar58;
            auVar38._8_4_ = local_25f0._8_4_ * fVar58;
            auVar38._12_4_ = local_25f0._12_4_ * fVar58;
            auVar50 = vcmpps_avx(auVar38,local_2600,1);
            fVar58 = *(float *)(ray + k * 4 + 0x80);
            auVar53._0_4_ = local_25f0._0_4_ * fVar58;
            auVar53._4_4_ = local_25f0._4_4_ * fVar58;
            auVar53._8_4_ = local_25f0._8_4_ * fVar58;
            auVar53._12_4_ = local_25f0._12_4_ * fVar58;
            auVar54 = vcmpps_avx(local_2600,auVar53,2);
            auVar50 = vandps_avx(auVar50,auVar54);
            auVar54 = auVar42 & auVar50;
            if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar54[0xf] < '\0') {
              local_2700 = vandps_avx(auVar42,auVar50);
              local_25d0 = local_2700;
              auVar42 = vrcpps_avx(local_25f0);
              auVar46._8_4_ = 0x3f800000;
              auVar46._0_8_ = 0x3f8000003f800000;
              auVar46._12_4_ = 0x3f800000;
              auVar50 = vfnmadd213ps_fma(local_25f0,auVar42,auVar46);
              auVar42 = vfmadd132ps_fma(auVar50,auVar42,auVar42);
              fVar68 = auVar42._0_4_;
              local_25a0._0_4_ = fVar68 * local_2600._0_4_;
              fVar74 = auVar42._4_4_;
              local_25a0._4_4_ = fVar74 * local_2600._4_4_;
              fVar75 = auVar42._8_4_;
              local_25a0._8_4_ = fVar75 * local_2600._8_4_;
              fVar76 = auVar42._12_4_;
              local_25a0._12_4_ = fVar76 * local_2600._12_4_;
              auVar62 = ZEXT1664(local_25a0);
              local_25c0[0] = fVar68 * local_2620._0_4_;
              local_25c0[1] = fVar74 * local_2620._4_4_;
              local_25c0[2] = fVar75 * local_2620._8_4_;
              local_25c0[3] = fVar76 * local_2620._12_4_;
              auVar47._8_4_ = 0x7f800000;
              auVar47._0_8_ = 0x7f8000007f800000;
              auVar47._12_4_ = 0x7f800000;
              auVar42 = vblendvps_avx(auVar47,local_25a0,local_2700);
              local_25b0[0] = fVar68 * local_2620._16_4_;
              local_25b0[1] = fVar74 * local_2620._20_4_;
              local_25b0[2] = fVar75 * local_2620._24_4_;
              local_25b0[3] = fVar76 * local_2620._28_4_;
              auVar50 = vshufps_avx(auVar42,auVar42,0xb1);
              auVar50 = vminps_avx(auVar50,auVar42);
              auVar54 = vshufpd_avx(auVar50,auVar50,1);
              auVar50 = vminps_avx(auVar54,auVar50);
              auVar42 = vcmpps_avx(auVar42,auVar50,0);
              auVar54 = local_2700 & auVar42;
              auVar50 = vpcmpeqd_avx(auVar50,auVar50);
              if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar54[0xf] < '\0') {
                auVar50 = auVar42;
              }
              auVar42 = vandps_avx(local_2700,auVar50);
              local_26f0 = pSVar20;
              do {
                auVar42 = vpslld_avx(auVar42,0x1f);
                uVar9 = vmovmskps_avx(auVar42);
                uVar26 = 0;
                for (uVar11 = CONCAT44((int)(uVar11 >> 0x20),uVar9); (uVar11 & 1) == 0;
                    uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                  uVar26 = uVar26 + 1;
                }
                local_24b0 = *(uint *)((long)&local_2520 + uVar26 * 4);
                uVar11 = (ulong)local_24b0;
                pGVar4 = (pSVar20->geometries).items[uVar11].ptr;
                if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  *(undefined4 *)(local_2700 + uVar26 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar11 = (ulong)(uint)((int)uVar26 << 2);
                    uVar9 = *(undefined4 *)((long)local_25c0 + uVar11);
                    uVar3 = *(undefined4 *)((long)local_25b0 + uVar11);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a0 + uVar11);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2590 + uVar11);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2580 + uVar11);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2570 + uVar11);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar9;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_2630 + uVar11);
                    *(uint *)(ray + k * 4 + 0x120) = local_24b0;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_26c0 = auVar62._0_16_;
                  uVar11 = (ulong)(uint)((int)uVar26 * 4);
                  uVar9 = *(undefined4 *)((long)local_25c0 + uVar11);
                  local_24e0._4_4_ = uVar9;
                  local_24e0._0_4_ = uVar9;
                  local_24e0._8_4_ = uVar9;
                  local_24e0._12_4_ = uVar9;
                  local_24d0 = *(undefined4 *)((long)local_25b0 + uVar11);
                  local_24c0 = *(undefined4 *)((long)&local_2630 + uVar11);
                  local_2510 = *(undefined4 *)(local_2590 + uVar11);
                  local_2500 = *(undefined4 *)(local_2580 + uVar11);
                  uVar9 = *(undefined4 *)(local_2570 + uVar11);
                  local_24f0._4_4_ = uVar9;
                  local_24f0._0_4_ = uVar9;
                  local_24f0._8_4_ = uVar9;
                  local_24f0._12_4_ = uVar9;
                  uStack_250c = local_2510;
                  uStack_2508 = local_2510;
                  uStack_2504 = local_2510;
                  uStack_24fc = local_2500;
                  uStack_24f8 = local_2500;
                  uStack_24f4 = local_2500;
                  uStack_24cc = local_24d0;
                  uStack_24c8 = local_24d0;
                  uStack_24c4 = local_24d0;
                  uStack_24bc = local_24c0;
                  uStack_24b8 = local_24c0;
                  uStack_24b4 = local_24c0;
                  uStack_24ac = local_24b0;
                  uStack_24a8 = local_24b0;
                  uStack_24a4 = local_24b0;
                  vpcmpeqd_avx2(ZEXT1632(local_24e0),ZEXT1632(local_24e0));
                  uStack_249c = context->user->instID[0];
                  local_24a0 = uStack_249c;
                  uStack_2498 = uStack_249c;
                  uStack_2494 = uStack_249c;
                  uStack_2490 = context->user->instPrimID[0];
                  uStack_248c = uStack_2490;
                  uStack_2488 = uStack_2490;
                  uStack_2484 = uStack_2490;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a0 + uVar11);
                  local_26b0 = *local_2698;
                  local_2660.valid = (int *)local_26b0;
                  local_2660.geometryUserPtr = pGVar4->userPtr;
                  local_2660.context = context->user;
                  local_2660.hit = (RTCHitN *)&local_2510;
                  local_2660.N = 4;
                  local_2660.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar4->intersectionFilterN)(&local_2660);
                  }
                  if (local_26b0 == (undefined1  [16])0x0) {
                    auVar42 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar42 = auVar42 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var5)(&local_2660);
                    }
                    auVar50 = vpcmpeqd_avx(local_26b0,_DAT_01f7aa10);
                    auVar42 = auVar50 ^ _DAT_01f7ae20;
                    if (local_26b0 != (undefined1  [16])0x0) {
                      auVar50 = auVar50 ^ _DAT_01f7ae20;
                      auVar54 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])local_2660.hit);
                      *(undefined1 (*) [16])(local_2660.ray + 0xc0) = auVar54;
                      auVar54 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])(local_2660.hit + 0x10)
                                              );
                      *(undefined1 (*) [16])(local_2660.ray + 0xd0) = auVar54;
                      auVar54 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])(local_2660.hit + 0x20)
                                              );
                      *(undefined1 (*) [16])(local_2660.ray + 0xe0) = auVar54;
                      auVar54 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])(local_2660.hit + 0x30)
                                              );
                      *(undefined1 (*) [16])(local_2660.ray + 0xf0) = auVar54;
                      auVar54 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])(local_2660.hit + 0x40)
                                              );
                      *(undefined1 (*) [16])(local_2660.ray + 0x100) = auVar54;
                      auVar54 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])(local_2660.hit + 0x50)
                                              );
                      *(undefined1 (*) [16])(local_2660.ray + 0x110) = auVar54;
                      auVar54 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])(local_2660.hit + 0x60)
                                              );
                      *(undefined1 (*) [16])(local_2660.ray + 0x120) = auVar54;
                      auVar54 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])(local_2660.hit + 0x70)
                                              );
                      *(undefined1 (*) [16])(local_2660.ray + 0x130) = auVar54;
                      auVar50 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])(local_2660.hit + 0x80)
                                              );
                      *(undefined1 (*) [16])(local_2660.ray + 0x140) = auVar50;
                    }
                  }
                  auVar39._8_8_ = 0x100000001;
                  auVar39._0_8_ = 0x100000001;
                  if ((auVar39 & auVar42) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar58;
                  }
                  else {
                    fVar58 = *(float *)(ray + k * 4 + 0x80);
                  }
                  *(undefined4 *)(local_2700 + uVar26 * 4) = 0;
                  auVar40._4_4_ = fVar58;
                  auVar40._0_4_ = fVar58;
                  auVar40._8_4_ = fVar58;
                  auVar40._12_4_ = fVar58;
                  auVar62 = ZEXT1664(local_26c0);
                  auVar42 = vcmpps_avx(local_26c0,auVar40,2);
                  local_2700 = vandps_avx(auVar42,local_2700);
                  uVar11 = uVar26;
                  pSVar20 = local_26f0;
                }
                if ((((local_2700 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_2700 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_2700 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_2700[0xf]) break;
                auVar48._8_4_ = 0x7f800000;
                auVar48._0_8_ = 0x7f8000007f800000;
                auVar48._12_4_ = 0x7f800000;
                auVar42 = vblendvps_avx(auVar48,auVar62._0_16_,local_2700);
                auVar50 = vshufps_avx(auVar42,auVar42,0xb1);
                auVar50 = vminps_avx(auVar50,auVar42);
                auVar54 = vshufpd_avx(auVar50,auVar50,1);
                auVar50 = vminps_avx(auVar54,auVar50);
                auVar50 = vcmpps_avx(auVar42,auVar50,0);
                auVar54 = local_2700 & auVar50;
                auVar42 = local_2700;
                if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar54[0xf] < '\0') {
                  auVar42 = vandps_avx(auVar50,local_2700);
                }
                auVar42 = vpcmpgtd_avx(ZEXT816(0) << 0x20,auVar42);
              } while( true );
            }
          }
          uVar11 = local_26e8 + 1;
        } while (uVar11 != local_2688);
      }
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar41 = ZEXT3264(CONCAT428(uVar9,CONCAT424(uVar9,CONCAT420(uVar9,CONCAT416(uVar9,CONCAT412(
                                                  uVar9,CONCAT48(uVar9,CONCAT44(uVar9,uVar9))))))));
      auVar62 = ZEXT3264(local_23c0);
      auVar67 = ZEXT3264(local_23e0);
      auVar73 = ZEXT3264(local_2400);
      auVar79 = ZEXT3264(local_2420);
      auVar86 = ZEXT3264(local_2440);
      auVar89 = ZEXT3264(local_2460);
      auVar92 = ZEXT3264(local_2480);
      uVar11 = local_2690;
    }
    if (pauVar10 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }